

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

double __thiscall
HistogramBasedDistribution::probability(HistogramBasedDistribution *this,int value)

{
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var1;
  double dVar2;
  
  dVar2 = 0.0;
  if ((this->min <= value) && (value <= this->max)) {
    _Var1 = std::
            __upper_bound<__gnu_cxx::__normal_iterator<std::pair<int,double>const*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::pair<int,double>,__gnu_cxx::__ops::_Val_less_iter>
                      ((this->values).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->values).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    dVar2 = _Var1._M_current[-1].second;
  }
  return dVar2;
}

Assistant:

double HistogramBasedDistribution::probability(int value) const {
	if (value < min) return 0.0;
	if (value > max) return 0.0;
	typedef vector<value_t>::const_iterator iter_t;
	iter_t cit = upper_bound(values.begin(), values.end(), make_pair(value,2.0));
	--cit;
	return cit->second;
}